

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void __thiscall IDLExport::generateTypedefs(IDLExport *this,ostream *stream)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  for (p_Var2 = (this->m_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_typedefs)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    adaptNamespace(this,stream,(string *)(p_Var2 + 1));
    p_Var3 = p_Var2 + 2;
    while (p_Var3 = *(_Rb_tree_node_base **)p_Var3, p_Var3 != p_Var2 + 2) {
      poVar1 = std::operator<<(stream,(string *)&this->m_indent);
      poVar1 = std::operator<<(poVar1,"typedef ");
      poVar1 = std::operator<<(poVar1,(string *)&p_Var3->_M_left);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  return;
}

Assistant:

void IDLExport::generateTypedefs(ostream& stream)
{
    for (TypedefMap::const_iterator it = m_typedefs.begin();
            it != m_typedefs.end(); ++it)
    {
        adaptNamespace(stream, it->first);

        list<string> const& lines = it->second;
        for (list<string>::const_iterator str_it = lines.begin(); str_it != lines.end(); ++str_it)
            stream << m_indent << "typedef " << *str_it << std::endl;
    }
}